

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

IvVec2 * __thiscall
deqp::egl::UpdateResolutionCase::getNativePixelsPerInch
          (IvVec2 *__return_storage_ptr__,UpdateResolutionCase *this)

{
  IvVec2 *pIVar1;
  Library *egl;
  IVec2 bufPp10km;
  IVec2 winSize;
  IVec2 bufSize;
  Vector<tcu::Interval,_2> res;
  Vector<int,_2> local_278;
  Vector<int,_2> local_270;
  Vector<int,_2> local_268;
  IvVec2 *local_260;
  Interval local_258;
  Interval local_240;
  Interval local_228;
  Interval local_210;
  undefined1 local_1f8 [8];
  _func_int **pp_Stack_1f0;
  undefined1 auStack_1e8 [16];
  _func_int **pp_Stack_1d8;
  qpTestLog *pqStack_1d0;
  ios_base local_180 [264];
  Interval local_78;
  Interval local_60;
  Interval local_48;
  
  local_260 = __return_storage_ptr__;
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  eglu::getSurfaceSize
            ((eglu *)&local_268,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  (*((this->super_ResizeTest).m_nativeWindow.
     super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr)->
    _vptr_NativeWindow[7])(&local_270);
  eglu::getSurfaceResolution
            ((eglu *)&local_278,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  approximateInt(&local_228,local_278.m_data[0]);
  approximateInt(&local_258,local_278.m_data[1]);
  auStack_1e8._0_8_ = local_228.m_hi;
  local_1f8 = (undefined1  [8])((ulong)(uint7)local_228._1_7_ << 8);
  pp_Stack_1f0 = (_func_int **)local_228.m_lo;
  pqStack_1d0 = (qpTestLog *)local_258.m_hi;
  auStack_1e8._8_8_ = local_258._0_8_;
  pp_Stack_1d8 = (_func_int **)local_258.m_lo;
  local_228.m_hasNaN = false;
  local_228.m_lo = 2540000.0;
  local_228.m_hi = 2540000.0;
  local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
  local_78.m_lo = INFINITY;
  local_78.m_hi = -INFINITY;
  local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
  local_60.m_lo = INFINITY;
  local_60.m_hi = -INFINITY;
  tcu::operator/(&local_258,(Interval *)local_1f8,&local_228);
  local_78.m_hi = local_258.m_hi;
  local_78.m_hasNaN = local_258.m_hasNaN;
  local_78._1_7_ = local_258._1_7_;
  local_78.m_lo = local_258.m_lo;
  tcu::operator/(&local_258,(Interval *)(auStack_1e8 + 8),&local_228);
  local_60.m_hi = local_258.m_hi;
  local_60.m_hasNaN = local_258.m_hasNaN;
  local_60._1_7_ = local_258._1_7_;
  local_60.m_lo = local_258.m_lo;
  local_258._0_8_ = local_258._0_8_ & 0xffffffffffffff00;
  local_240.m_hasNaN = false;
  local_240.m_lo = (double)local_270.m_data[1];
  local_258.m_lo = (double)local_270.m_data[0];
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffffffffff00);
  pp_Stack_1f0 = (_func_int **)0x7ff0000000000000;
  auStack_1e8._0_8_ = (qpTestLog *)0xfff0000000000000;
  auStack_1e8._8_8_ = auStack_1e8._8_8_ & 0xffffffffffffff00;
  pp_Stack_1d8 = (_func_int **)0x7ff0000000000000;
  pqStack_1d0 = (qpTestLog *)0xfff0000000000000;
  local_258.m_hi = local_258.m_lo;
  local_240.m_hi = local_240.m_lo;
  tcu::operator*(&local_228,&local_258,&local_78);
  auStack_1e8._0_8_ = local_228.m_hi;
  local_1f8 = (undefined1  [8])CONCAT71(local_228._1_7_,local_228.m_hasNaN);
  pp_Stack_1f0 = (_func_int **)local_228.m_lo;
  tcu::operator*(&local_228,&local_240,&local_60);
  pIVar1 = local_260;
  pqStack_1d0 = (qpTestLog *)local_228.m_hi;
  auStack_1e8._9_7_ = local_228._1_7_;
  auStack_1e8[8] = local_228.m_hasNaN;
  pp_Stack_1d8 = (_func_int **)local_228.m_lo;
  local_228.m_hasNaN = false;
  local_210.m_hasNaN = false;
  local_210.m_lo = (double)local_268.m_data[1];
  local_228.m_lo = (double)local_268.m_data[0];
  local_260->m_data[0].m_hasNaN = false;
  local_260->m_data[0].m_lo = INFINITY;
  local_260->m_data[0].m_hi = -INFINITY;
  local_260->m_data[1].m_hasNaN = false;
  local_260->m_data[1].m_lo = INFINITY;
  local_260->m_data[1].m_hi = -INFINITY;
  local_228.m_hi = local_228.m_lo;
  local_210.m_hi = local_210.m_lo;
  tcu::operator/(&local_48,(Interval *)local_1f8,&local_228);
  pIVar1->m_data[0].m_hi = local_48.m_hi;
  pIVar1->m_data[0].m_hasNaN = local_48.m_hasNaN;
  *(undefined7 *)&pIVar1->m_data[0].field_0x1 = local_48._1_7_;
  pIVar1->m_data[0].m_lo = local_48.m_lo;
  tcu::operator/(&local_48,(Interval *)(auStack_1e8 + 8),&local_210);
  pIVar1->m_data[1].m_hi = local_48.m_hi;
  pIVar1->m_data[1].m_hasNaN = local_48.m_hasNaN;
  *(undefined7 *)&pIVar1->m_data[1].field_0x1 = local_48._1_7_;
  pIVar1->m_data[1].m_lo = local_48.m_lo;
  local_258._4_4_ = (int)((pIVar1->m_data[1].m_hi + pIVar1->m_data[1].m_lo) * 0.5);
  local_258._0_4_ = (int)((pIVar1->m_data[0].m_hi + pIVar1->m_data[0].m_lo) * 0.5);
  local_1f8 = (undefined1  [8])(this->super_ResizeTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1f0,"EGL surface size: ",0x12);
  tcu::operator<<((ostream *)&pp_Stack_1f0,&local_268);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1f0,"EGL surface pixel density (pixels / 10 km): ",0x2c);
  tcu::operator<<((ostream *)&pp_Stack_1f0,&local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1f0,"Native window size: ",0x14);
  tcu::operator<<((ostream *)&pp_Stack_1f0,&local_270);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1f0,"Native pixel density (ppi): ",0x1c);
  tcu::operator<<((ostream *)&pp_Stack_1f0,(Vector<int,_2> *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
  std::ios_base::~ios_base(local_180);
  local_1f8 = (undefined1  [8])auStack_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f8,
             "Surface pixel density is less than one pixel per 10 km. Is the surface really visible from space?"
             ,"");
  tcu::ResultCollector::checkResult
            (&(this->super_ResizeTest).m_status,0 < local_278.m_data[1] && 0 < local_278.m_data[0],
             QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1f8);
  if (local_1f8 != (undefined1  [8])auStack_1e8) {
    operator_delete((void *)local_1f8,(ulong)(auStack_1e8._0_8_ + 1));
  }
  return pIVar1;
}

Assistant:

IvVec2 UpdateResolutionCase::getNativePixelsPerInch	(void)
{
	const Library&	egl			= m_eglTestCtx.getLibrary();
	const int		inchPer10km	= 254 * EGL_DISPLAY_SCALING;
	const IVec2		bufSize		= eglu::getSurfaceSize(egl, m_display, **m_surface);
	const IVec2		winSize		= m_nativeWindow->getScreenSize();
	const IVec2		bufPp10km	= eglu::getSurfaceResolution(egl, m_display, **m_surface);
	const IvVec2	bufPpiI		= (IvVec2(approximateInt(bufPp10km.x()),
										  approximateInt(bufPp10km.y()))
								   / Interval(inchPer10km));
	const IvVec2	winPpiI		= ivVec2(winSize) * bufPpiI / ivVec2(bufSize);
	const IVec2		winPpi		(int(winPpiI.x().midpoint()), int(winPpiI.y().midpoint()));

	m_log << TestLog::Message
		  << "EGL surface size: "							<< bufSize		<< "\n"
		  << "EGL surface pixel density (pixels / 10 km): "	<< bufPp10km	<< "\n"
		  << "Native window size: "							<< winSize		<< "\n"
		  << "Native pixel density (ppi): "					<< winPpi		<< "\n"
		  << TestLog::EndMessage;

	m_status.checkResult(bufPp10km.x() >= 1 && bufPp10km.y() >= 1,
						 QP_TEST_RESULT_QUALITY_WARNING,
						 "Surface pixel density is less than one pixel per 10 km. "
						 "Is the surface really visible from space?");

	return winPpiI;
}